

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O2

shared_ptr<mocker::ir::Addr> __thiscall
mocker::ir::Builder::makeNewNonarray(Builder *this,shared_ptr<mocker::ast::Type> *type)

{
  string *hint;
  undefined8 uVar1;
  shared_ptr<mocker::ast::Type> *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  shared_ptr<mocker::ast::Type> *val;
  shared_ptr<mocker::ir::Reg> *args;
  shared_ptr<mocker::ir::Addr> sVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> ctorName;
  shared_ptr<mocker::ir::Reg> instancePtr;
  shared_ptr<mocker::ir::Addr> typeSize;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a8;
  undefined1 local_88 [32];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  string local_40;
  
  std::dynamic_pointer_cast<mocker::ast::ArrayType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)&local_a8);
  if (local_a8._M_dataplus._M_p != (pointer)0x0) {
    __assert_fail("!std::dynamic_pointer_cast<ast::ArrayType>(type)",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x3bc,
                  "std::shared_ptr<Addr> mocker::ir::Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &) const"
                 );
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
  std::dynamic_pointer_cast<mocker::ast::BuiltinType,mocker::ast::Type>
            ((shared_ptr<mocker::ast::Type> *)&local_a8);
  if ((local_a8._M_dataplus._M_p != (pointer)0x0) &&
     (*(int *)(local_a8._M_dataplus._M_p + 0x18) != 2)) {
    __assert_fail("p->type == ast::BuiltinType::String",
                  "/workspace/llm4binary/github/license_c_cmakelists/Engineev[P]mocker/compiler/ir_builder/builder.cpp"
                  ,0x3be,
                  "std::shared_ptr<Addr> mocker::ir::Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &) const"
                 );
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_a8._M_string_length);
  val = in_RDX;
  getTypeSize((Builder *)type,in_RDX);
  makeILit((Builder *)(local_88 + 0x18),(Integer)val);
  hint = (string *)
         (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi
  ;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_a8,"instPtr",(allocator<char> *)&local_60);
  BuilderContext::makeTempLocalReg((BuilderContext *)local_88,hint);
  std::__cxx11::string::~string((string *)&local_a8);
  args = (shared_ptr<mocker::ir::Reg> *)local_88;
  BuilderContext::
  emplaceInst<mocker::ir::Malloc,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Addr>&>
            ((BuilderContext *)
             (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,args,(shared_ptr<mocker::ir::Addr> *)(local_88 + 0x18));
  getTypeIdentifier_abi_cxx11_(&local_40,(Builder *)args,in_RDX);
  std::operator+(&local_60,"#",&local_40);
  std::operator+(&local_a8,&local_60,"#_ctor_");
  std::__cxx11::string::~string((string *)&local_60);
  std::__cxx11::string::~string((string *)&local_40);
  BuilderContext::
  emplaceInst<mocker::ir::Call,std::__cxx11::string&,std::shared_ptr<mocker::ir::Reg>&>
            ((BuilderContext *)
             (type->super___shared_ptr<mocker::ast::Type,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi,&local_a8,(shared_ptr<mocker::ir::Reg> *)local_88);
  uVar1 = local_88._8_8_;
  local_88._8_8_ = (_List_node_base *)0x0;
  *(undefined8 *)this = local_88._0_8_;
  this->ctx = (BuilderContext *)uVar1;
  local_88._0_8_ = (element_type *)0x0;
  std::__cxx11::string::~string((string *)&local_a8);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_88 + 8));
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_68);
  sVar2.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  sVar2.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<mocker::ir::Addr>)
         sVar2.super___shared_ptr<mocker::ir::Addr,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

std::shared_ptr<Addr>
Builder::makeNewNonarray(const std::shared_ptr<ast::Type> &type) const {
  assert(!std::dynamic_pointer_cast<ast::ArrayType>(type));
  if (auto p = std::dynamic_pointer_cast<ast::BuiltinType>(type))
    assert(p->type == ast::BuiltinType::String);

  auto typeSize = makeILit((Integer)getTypeSize(type));
  auto instancePtr = ctx.makeTempLocalReg("instPtr");
  ctx.emplaceInst<Malloc>(instancePtr, typeSize);
  auto ctorName = "#" + getTypeIdentifier(type) + "#_ctor_";
  ctx.emplaceInst<Call>(ctorName, instancePtr);
  return instancePtr;
}